

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tm *ptVar4;
  time_t tt;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar4 = gmtime(&tStack_18);
  if (ptVar4 != (tm *)0x0) {
    pOut->tm_mon = ptVar4->tm_mon;
    iVar1 = ptVar4->tm_min;
    iVar2 = ptVar4->tm_hour;
    iVar3 = ptVar4->tm_mday;
    pOut->tm_sec = ptVar4->tm_sec;
    pOut->tm_min = iVar1;
    pOut->tm_hour = iVar2;
    pOut->tm_mday = iVar3;
    pOut->tm_year = ptVar4->tm_year + 0x76c;
    iVar1 = ptVar4->tm_yday;
    pOut->tm_wday = ptVar4->tm_wday;
    pOut->tm_yday = iVar1;
    pOut->tm_isdst = ptVar4->tm_isdst;
    pOut->tm_zone = (char *)0x0;
    pOut->tm_gmtoff = 0;
  }
  return 0;
}

Assistant:

static int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)
{
	struct tm *pTm;
	time_t tt;
	SXUNUSED(pVfs);
	time(&tt);
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
	return UNQLITE_OK;
}